

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightLeSample * __thiscall
pbrt::GoniometricLight::SampleLe
          (LightLeSample *__return_storage_ptr__,GoniometricLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  undefined8 uVar1;
  float cosTheta;
  float sinTheta;
  undefined1 auVar2 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar6 [64];
  undefined1 auVar8 [16];
  Vector3f wl;
  SampledSpectrum SVar9;
  Float pdf;
  Ray ray;
  ulong uStack_90;
  Float local_88;
  float local_74;
  Ray local_70;
  Ray local_48;
  undefined1 extraout_var [56];
  undefined1 auVar5 [56];
  undefined1 auVar7 [56];
  
  auVar2._0_8_ = PiecewiseConstant2D::Sample(&this->distrib,u1,&local_74);
  auVar2._8_56_ = extraout_var;
  auVar8 = vmovshdup_avx(auVar2._0_16_);
  cosTheta = cosf(auVar8._0_4_);
  sinTheta = sinf(auVar8._0_4_);
  local_88 = auVar2._0_4_;
  auVar5 = extraout_var_00;
  wl = SphericalDirection(sinTheta,cosTheta,local_88);
  local_70.d.super_Tuple3<pbrt::Vector3,_float>.z = wl.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = wl.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar5;
  local_70.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_LightBase).mediumInterface.inside.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_70.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar3._0_16_);
  auVar8._0_12_ = ZEXT812(0);
  auVar8._12_4_ = 0;
  uVar1 = vcmpss_avx512f(ZEXT416((uint)sinTheta),auVar8,0);
  local_70.time = time;
  Transform::operator()(&local_48,&(this->super_LightBase).renderFromLight,&local_70,(Float *)0x0);
  uStack_90 = auVar5._0_8_;
  auVar7 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
  auVar5 = ZEXT856(uStack_90);
  SVar9 = Scale(this,wl,lambda);
  auVar6._0_8_ = SVar9.values.values._8_8_;
  auVar6._8_56_ = auVar7;
  auVar4._0_8_ = SVar9.values.values._0_8_;
  auVar4._8_56_ = auVar5;
  auVar8 = vmovlhps_avx(auVar4._0_16_,auVar6._0_16_);
  *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar8;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x =
       local_48.o.super_Tuple3<pbrt::Point3,_float>.x;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       local_48.o.super_Tuple3<pbrt::Point3,_float>.y;
  *(ulong *)&(__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       CONCAT44(local_48.d.super_Tuple3<pbrt::Vector3,_float>.x,
                local_48.o.super_Tuple3<pbrt::Point3,_float>.z);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
       local_48.d.super_Tuple3<pbrt::Vector3,_float>.x;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       local_48.d.super_Tuple3<pbrt::Vector3,_float>.y;
  *(undefined8 *)&(__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
       local_48._20_8_;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (uintptr_t)
          local_48.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0;
  __return_storage_ptr__->pdfDir =
       (Float)((uint)!(bool)((byte)uVar1 & 1) * (int)(local_74 / sinTheta));
  return __return_storage_ptr__;
}

Assistant:

LightLeSample GoniometricLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                         SampledWavelengths &lambda, Float time) const {
    Float pdf;
    Point2f uv = distrib.Sample(u1, &pdf);
    Float theta = uv[1], phi = uv[0];
    Float cosTheta = std::cos(theta), sinTheta = std::sin(theta);
    Vector3f wl = SphericalDirection(sinTheta, cosTheta, phi);
    Float pdfDir = sinTheta == 0 ? 0 : pdf / sinTheta;

    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.inside));
    return LightLeSample(Scale(wl, lambda), ray, 1, pdfDir);
}